

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O1

int greatest_memory_printf_cb(void *t,void *udata)

{
  ulong uVar1;
  byte bVar2;
  FILE *__stream;
  int iVar3;
  ushort **ppuVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  __stream = _stdout;
  uVar5 = *(ulong *)((long)udata + 0x10);
  if (uVar5 == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    uVar10 = 0;
    do {
      uVar5 = uVar5 - uVar10;
      uVar9 = 0x10;
      if (uVar5 < 0x10) {
        uVar9 = uVar5;
      }
      uVar1 = uVar10 + uVar9;
      uVar6 = 0x20;
      if (uVar10 < uVar1) {
        uVar6 = 0x20;
        uVar7 = 0;
        do {
          if (*(char *)(*udata + uVar10 + uVar7) !=
              *(char *)(*(long *)((long)udata + 8) + uVar10 + uVar7)) {
            uVar6 = 0x58;
          }
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      iVar3 = fprintf(__stream,"\n%04x %c ",uVar10 & 0xffffffff,uVar6);
      iVar8 = iVar8 + iVar3;
      uVar7 = uVar10;
      uVar11 = uVar9;
      if (uVar10 < uVar1) {
        do {
          uVar6 = 0x20;
          if (*(char *)(*udata + uVar7) != *(char *)(*(long *)((long)udata + 8) + uVar7)) {
            uVar6 = 0x3c;
          }
          iVar3 = fprintf(__stream,"%02x%c",(ulong)*(byte *)((long)t + uVar7),uVar6);
          iVar8 = iVar8 + iVar3;
          uVar7 = uVar7 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      if (uVar5 < 0x10) {
        lVar12 = uVar9 - 0x10;
        do {
          iVar3 = fprintf(__stream,"   ");
          iVar8 = iVar8 + iVar3;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
      fputc(0x20,__stream);
      if (uVar10 < uVar1) {
        ppuVar4 = __ctype_b_loc();
        uVar5 = 0;
        do {
          bVar2 = *(byte *)((long)t + uVar5 + uVar10);
          uVar7 = 0x2e;
          if (((*ppuVar4)[bVar2] >> 0xe & 1) != 0) {
            uVar7 = (ulong)bVar2;
          }
          iVar3 = fprintf(__stream,"%c",uVar7);
          iVar8 = iVar8 + iVar3;
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
      }
      uVar5 = *(ulong *)((long)udata + 0x10);
      uVar10 = uVar1;
    } while (uVar1 < uVar5);
  }
  iVar3 = fprintf(__stream,"\n");
  return iVar3 + iVar8;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}